

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O0

int uv_poll_start(uv_poll_t *handle,int pevents,uv_poll_cb poll_cb)

{
  uint local_2c;
  int events;
  uv_poll_cb poll_cb_local;
  int pevents_local;
  uv_poll_t *handle_local;
  
  if ((pevents & 0xfffffff0U) != 0) {
    __assert_fail("(pevents & ~(UV_READABLE | UV_WRITABLE | UV_DISCONNECT | UV_PRIORITIZED)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/poll.c"
                  ,0x7a,"int uv_poll_start(uv_poll_t *, int, uv_poll_cb)");
  }
  if ((handle->flags & 3) == 0) {
    uv__poll_stop(handle);
    if (pevents != 0) {
      local_2c = (uint)((pevents & 1U) != 0);
      if ((pevents & 8U) != 0) {
        local_2c = local_2c | 2;
      }
      if ((pevents & 2U) != 0) {
        local_2c = local_2c | 4;
      }
      if ((pevents & 4U) != 0) {
        local_2c = local_2c | 0x2000;
      }
      uv__io_start(handle->loop,&handle->io_watcher,local_2c);
      if (((handle->flags & 4) == 0) &&
         (handle->flags = handle->flags | 4, (handle->flags & 8) != 0)) {
        handle->loop->active_handles = handle->loop->active_handles + 1;
      }
      handle->poll_cb = poll_cb;
    }
    return 0;
  }
  __assert_fail("!uv__is_closing(handle)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/poll.c"
                ,0x7b,"int uv_poll_start(uv_poll_t *, int, uv_poll_cb)");
}

Assistant:

int uv_poll_start(uv_poll_t* handle, int pevents, uv_poll_cb poll_cb) {
  int events;

  assert((pevents & ~(UV_READABLE | UV_WRITABLE | UV_DISCONNECT |
                      UV_PRIORITIZED)) == 0);
  assert(!uv__is_closing(handle));

  uv__poll_stop(handle);

  if (pevents == 0)
    return 0;

  events = 0;
  if (pevents & UV_READABLE)
    events |= POLLIN;
  if (pevents & UV_PRIORITIZED)
    events |= UV__POLLPRI;
  if (pevents & UV_WRITABLE)
    events |= POLLOUT;
  if (pevents & UV_DISCONNECT)
    events |= UV__POLLRDHUP;

  uv__io_start(handle->loop, &handle->io_watcher, events);
  uv__handle_start(handle);
  handle->poll_cb = poll_cb;

  return 0;
}